

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void serialize_node<std::ostream>
               (SingleTreeIndex *node,basic_ostream<char,_std::char_traits<char>_> *out)

{
  size_t vec_size;
  size_t local_20;
  
  if (!interrupt_switch) {
    local_20 = (long)(node->terminal_node_mappings).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(node->terminal_node_mappings).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    write_bytes<unsigned_long>(&local_20,1,out);
    if (local_20 != 0) {
      write_bytes<unsigned_long>
                ((node->terminal_node_mappings).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,local_20,out);
    }
    local_20 = (long)(node->node_distances).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(node->node_distances).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
    write_bytes<unsigned_long>(&local_20,1,out);
    if (local_20 != 0) {
      write_bytes<double>((node->node_distances).super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start,local_20,out);
    }
    local_20 = (long)(node->node_depths).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(node->node_depths).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3;
    write_bytes<unsigned_long>(&local_20,1,out);
    if (local_20 != 0) {
      write_bytes<double>((node->node_depths).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,local_20,out);
    }
    local_20 = (long)(node->reference_points).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(node->reference_points).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    write_bytes<unsigned_long>(&local_20,1,out);
    if (local_20 != 0) {
      write_bytes<unsigned_long>
                ((node->reference_points).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,local_20,out);
    }
    local_20 = (long)(node->reference_indptr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(node->reference_indptr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    write_bytes<unsigned_long>(&local_20,1,out);
    if (local_20 != 0) {
      write_bytes<unsigned_long>
                ((node->reference_indptr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,local_20,out);
    }
    local_20 = (long)(node->reference_mapping).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(node->reference_mapping).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    write_bytes<unsigned_long>(&local_20,1,out);
    if (local_20 != 0) {
      write_bytes<unsigned_long>
                ((node->reference_mapping).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,local_20,out);
    }
    local_20 = node->n_terminal;
    write_bytes<unsigned_long>(&local_20,1,out);
  }
  return;
}

Assistant:

void serialize_node(const SingleTreeIndex &node, otype &out)
{
    if (interrupt_switch) return;

    size_t vec_size = node.terminal_node_mappings.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.terminal_node_mappings.data(), vec_size, out);

    vec_size = node.node_distances.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<double>((void*)node.node_distances.data(), vec_size, out);

    vec_size = node.node_depths.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<double>((void*)node.node_depths.data(), vec_size, out);

    vec_size = node.reference_points.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.reference_points.data(), vec_size, out);

    vec_size = node.reference_indptr.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.reference_indptr.data(), vec_size, out);

    vec_size = node.reference_mapping.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.reference_mapping.data(), vec_size, out);

    vec_size = node.n_terminal;
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
}